

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VmaAllocation_T * __thiscall
VmaPoolAllocator<VmaAllocation_T>::Alloc<bool_const&>
          (VmaPoolAllocator<VmaAllocation_T> *this,bool *args)

{
  ItemBlock *pIVar1;
  Item *pIVar2;
  byte *in_RSI;
  long in_RDI;
  VmaAllocation_T *result;
  Item *pItem;
  ItemBlock *newBlock;
  VmaAllocation_T *result_1;
  Item *pItem_1;
  ItemBlock *block;
  size_t i;
  VmaPoolAllocator<VmaAllocation_T> *in_stack_ffffffffffffffd0;
  size_t local_20;
  
  local_20 = VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
             ::size((VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
                     *)(in_RDI + 0x10));
  do {
    if (local_20 == 0) {
      pIVar1 = CreateNewBlock(in_stack_ffffffffffffffd0);
      pIVar2 = pIVar1->pItems;
      pIVar1->FirstFreeIndex = pIVar2->NextFreeIndex;
      VmaAllocation_T::VmaAllocation_T((VmaAllocation_T *)pIVar2,(bool)(*in_RSI & 1));
      return (VmaAllocation_T *)pIVar2;
    }
    pIVar1 = VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
             ::operator[]((VmaVector<VmaPoolAllocator<VmaAllocation_T>::ItemBlock,_VmaStlAllocator<VmaPoolAllocator<VmaAllocation_T>::ItemBlock>_>
                           *)(in_RDI + 0x10),local_20 - 1);
    local_20 = local_20 - 1;
  } while (pIVar1->FirstFreeIndex == 0xffffffff);
  pIVar2 = pIVar1->pItems + pIVar1->FirstFreeIndex;
  pIVar1->FirstFreeIndex = pIVar2->NextFreeIndex;
  VmaAllocation_T::VmaAllocation_T((VmaAllocation_T *)pIVar2,(bool)(*in_RSI & 1));
  return (VmaAllocation_T *)pIVar2;
}

Assistant:

T* VmaPoolAllocator<T>::Alloc(Types&&... args)
{
    for (size_t i = m_ItemBlocks.size(); i--; )
    {
        ItemBlock& block = m_ItemBlocks[i];
        // This block has some free items: Use first one.
        if (block.FirstFreeIndex != UINT32_MAX)
        {
            Item* const pItem = &block.pItems[block.FirstFreeIndex];
            block.FirstFreeIndex = pItem->NextFreeIndex;
            T* result = (T*)&pItem->Value;
            new(result)T(std::forward<Types>(args)...); // Explicit constructor call.
            return result;
        }
    }

    // No block has free item: Create new one and use it.
    ItemBlock& newBlock = CreateNewBlock();
    Item* const pItem = &newBlock.pItems[0];
    newBlock.FirstFreeIndex = pItem->NextFreeIndex;
    T* result = (T*)&pItem->Value;
    new(result) T(std::forward<Types>(args)...); // Explicit constructor call.
    return result;
}